

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonLabelCompare(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  u32 uVar4;
  undefined8 in_RAX;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT71((int7)((ulong)in_RAX >> 8),rawLeft == 0);
  if (rawRight != 0 && rawLeft != 0) {
    uVar2 = 0;
    if (nLeft == nRight) {
      iVar3 = bcmp(zLeft,zRight,(ulong)nLeft);
      uVar2 = (uint)(iVar3 == 0);
    }
    return uVar2;
  }
  while( true ) {
    if (nLeft == 0) {
      uStack_38 = uStack_38 & 0xffffffff;
      nLeft = 0;
    }
    else {
      bVar1 = *zLeft;
      if ((rawLeft == 0) && (bVar1 == 0x5c)) {
        uVar4 = jsonUnescapeOneChar(zLeft,nLeft,(u32 *)((long)&uStack_38 + 4));
        zLeft = (char *)((byte *)zLeft + uVar4);
        nLeft = nLeft - uVar4;
      }
      else {
        uStack_38 = (ulong)CONCAT14(bVar1,(u32)uStack_38);
        if (bVar1 < 0xc0) {
          zLeft = (char *)((byte *)zLeft + 1);
          nLeft = nLeft - 1;
        }
        else {
          iVar3 = sqlite3Utf8ReadLimited((u8 *)zLeft,nLeft,(u32 *)((long)&uStack_38 + 4));
          zLeft = (char *)((byte *)zLeft + iVar3);
          nLeft = nLeft - iVar3;
        }
      }
    }
    if (nRight == 0) {
      uStack_38 = (ulong)uStack_38._4_4_ << 0x20;
      nRight = 0;
    }
    else {
      bVar1 = *zRight;
      if ((rawRight == 0) && (bVar1 == 0x5c)) {
        uVar4 = jsonUnescapeOneChar(zRight,nRight,(u32 *)&uStack_38);
        zRight = (char *)((byte *)zRight + uVar4);
        nRight = nRight - uVar4;
      }
      else {
        uStack_38 = CONCAT44(uStack_38._4_4_,(uint)bVar1);
        if (bVar1 < 0xc0) {
          zRight = (char *)((byte *)zRight + 1);
          nRight = nRight - 1;
        }
        else {
          iVar3 = sqlite3Utf8ReadLimited((u8 *)zRight,nRight,(u32 *)&uStack_38);
          zRight = (char *)((byte *)zRight + iVar3);
          nRight = nRight - iVar3;
        }
      }
    }
    if (uStack_38._4_4_ != (u32)uStack_38) break;
    if (uStack_38._4_4_ == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int jsonLabelCompare(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  if( rawLeft && rawRight ){
    /* Simpliest case:  Neither label contains escapes.  A simple
    ** memcmp() is sufficient. */
    if( nLeft!=nRight ) return 0;
    return memcmp(zLeft, zRight, nLeft)==0;
  }else{
    return jsonLabelCompareEscaped(zLeft, nLeft, rawLeft,
                                   zRight, nRight, rawRight);
  }
}